

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

long __thiscall CVmObjString::cast_to_int(CVmObjString *this)

{
  vm_val_t val;
  int in_stack_00000058;
  int in_stack_0000005c;
  size_t in_stack_00000060;
  char *in_stack_00000068;
  vm_val_t *in_stack_00000070;
  undefined4 local_10;
  
  vmb_get_len((char *)0x3925d4);
  parse_num_val(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
                in_stack_00000058);
  return (long)local_10;
}

Assistant:

long CVmObjString::cast_to_int(VMG0_) const
{
    /* 
     *   parse the string as an integer in decimal format; this is an
     *   explicit int cast, so don't allow BigNumber promotions 
     */
    vm_val_t val;
    parse_num_val(vmg_ &val, ext_ + VMB_LEN, vmb_get_len(ext_), 10, TRUE);

    /* return the integer value */
    return val.val.intval;
}